

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

void __thiscall
libDAI::JTree::GenerateJT
          (JTree *this,vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *Cliques)

{
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *pvVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_type sVar5;
  size_type sVar6;
  mapped_type_conflict1 *pmVar7;
  ulong uVar8;
  size_t sVar9;
  FRegion *this_00;
  TFactor<double> *this_01;
  reference pvVar10;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *pvVar11;
  ostream *poVar12;
  RegionGraph *rg;
  RegionGraph *this_02;
  ulong uVar13;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *in_RSI;
  long *in_RDI;
  size_t e;
  size_t beta;
  size_t alpha_1;
  size_t i_2;
  size_t alpha;
  size_t I;
  size_t i_1;
  size_t w;
  size_t j;
  size_t i;
  WeightedGraph<int> JuncGraph;
  size_t N;
  value_type *in_stack_fffffffffffffb08;
  RegionGraph *in_stack_fffffffffffffb10;
  Factor *in_stack_fffffffffffffb18;
  RegionGraph *in_stack_fffffffffffffb20;
  VarSet *in_stack_fffffffffffffb28;
  TFactor<double> *in_stack_fffffffffffffb30;
  size_type in_stack_fffffffffffffb38;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffb40;
  key_type *in_stack_fffffffffffffb48;
  RegionGraph *in_stack_fffffffffffffb50;
  VarSet *in_stack_fffffffffffffba0;
  VarSet *in_stack_fffffffffffffba8;
  WeightedGraph<int> *in_stack_fffffffffffffd08;
  ulong local_218;
  ulong local_1d8;
  ulong local_1d0;
  size_type local_180;
  pair<unsigned_long,_unsigned_long> local_178;
  size_type local_168;
  pair<unsigned_long,_unsigned_long> local_160;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_c0;
  UEdge local_a0 [4];
  size_type local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_18;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *local_10;
  
  local_10 = in_RSI;
  plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
  local_18 = (**(code **)(*plVar4 + 0x28))();
  WeightedGraph<int>::WeightedGraph((WeightedGraph<int> *)0xb626ab);
  for (local_50 = 0; uVar13 = local_50,
      sVar5 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::size(local_10),
      sVar9 = local_50, uVar13 < sVar5; local_50 = local_50 + 1) {
    while( true ) {
      local_58 = sVar9 + 1;
      uVar13 = local_58;
      sVar5 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::size(local_10);
      if (sVar5 <= uVar13) break;
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[](local_10,local_50);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[](local_10,local_58);
      VarSet::operator&(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      sVar6 = VarSet::size((VarSet *)0xb62786);
      VarSet::~VarSet((VarSet *)0xb6279d);
      local_60 = sVar6;
      sVar9 = local_58;
      if (sVar6 != 0) {
        local_60._0_4_ = (int)sVar6;
        iVar3 = (int)local_18 - (int)local_60;
        UEdge::UEdge(local_a0,local_50,local_58);
        pmVar7 = std::
                 map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                 ::operator[]((map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                               *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        *pmVar7 = iVar3;
        sVar9 = local_58;
      }
    }
  }
  MinSpanningTreePrims<int>(in_stack_fffffffffffffd08);
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator=
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffb20,
             (vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffb18);
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~vector
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffb20);
  (**(code **)(*in_RDI + 0x28))();
  RegionGraph::ORs((RegionGraph *)0xb62909);
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::size(local_10);
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)in_stack_fffffffffffffb50,
             (size_type)in_stack_fffffffffffffb48);
  for (local_c0 = 0; uVar13 = local_c0,
      sVar5 = std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::size(local_10),
      uVar13 < sVar5; local_c0 = local_c0 + 1) {
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::ORs((RegionGraph *)0xb62997);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[](local_10,local_c0);
    TFactor<double>::TFactor
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Real)in_stack_fffffffffffffb20);
    FRegion::FRegion((FRegion *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                     (double)in_stack_fffffffffffffb10);
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::push_back
              ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
               in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    FRegion::~FRegion((FRegion *)0xb62a13);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb10);
  }
  local_140 = 0;
  do {
    uVar13 = local_140;
    plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar8 = (**(code **)(*plVar4 + 0x48))();
    if (uVar8 <= uVar13) {
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::RecomputeORs(in_stack_fffffffffffffb50);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::IRs((RegionGraph *)0xb62ce9);
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f));
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
                ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                 in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::Redges((RegionGraph *)0xb62d41);
      std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f));
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::reserve(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      for (local_150 = 0; uVar13 = local_150,
          sVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                             (in_RDI + 0x3f)), uVar13 < sVar5; local_150 = local_150 + 1) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::Redges((RegionGraph *)0xb62de0);
        pvVar10 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                             (in_RDI + 0x3f),local_150);
        (**(code **)(*in_RDI + 0x28))();
        pvVar11 = RegionGraph::IRs((RegionGraph *)0xb62e36);
        local_168 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar11);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                  (&local_160,&pvVar10->n1,&local_168);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::Redges((RegionGraph *)0xb62eb3);
        pvVar10 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                             (in_RDI + 0x3f),local_150);
        (**(code **)(*in_RDI + 0x28))();
        pvVar11 = RegionGraph::IRs((RegionGraph *)0xb62f0d);
        local_180 = std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::size(pvVar11);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long,_true>
                  (&local_178,&pvVar10->n2,&local_180);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::IRs((RegionGraph *)0xb62f8a);
        pvVar1 = local_10;
        pvVar10 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                             (in_RDI + 0x3f),local_150);
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[](pvVar1,pvVar10->n1)
        ;
        pvVar1 = local_10;
        pvVar10 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                             (in_RDI + 0x3f),local_150);
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::operator[](pvVar1,pvVar10->n2)
        ;
        VarSet::operator&(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
        Region::Region((Region *)in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->_vs,
                       (double)in_stack_fffffffffffffb10);
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back
                  ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                   in_stack_fffffffffffffb10,(value_type *)in_stack_fffffffffffffb08);
        Region::~Region((Region *)0xb63073);
        VarSet::~VarSet((VarSet *)0xb63080);
      }
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::Regenerate((RegionGraph *)0xb6310a);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 0xb63128);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nr_ORs((RegionGraph *)0xb63150);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      local_1d0 = 0;
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        sVar9 = RegionGraph::nr_ORs((RegionGraph *)0xb631b5);
        if (sVar9 <= local_1d0) break;
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::OR(in_stack_fffffffffffffb10,(long)in_stack_fffffffffffffb08);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        local_1d0 = local_1d0 + 1;
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 0xb6326d);
      (**(code **)(*in_RDI + 0x28))();
      poVar12 = (ostream *)RegionGraph::nr_IRs((RegionGraph *)0xb63295);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      local_1d8 = 0;
      while( true ) {
        rg = (RegionGraph *)(**(code **)(*in_RDI + 0x28))();
        sVar9 = RegionGraph::nr_IRs((RegionGraph *)0xb632fa);
        if (sVar9 <= local_1d8) break;
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::IR(in_stack_fffffffffffffb10,(long)in_stack_fffffffffffffb08);
        TFactor<double>::TFactor
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (Real)in_stack_fffffffffffffb20);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_fffffffffffffb10,&in_stack_fffffffffffffb08->super_Factor);
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb10);
        local_1d8 = local_1d8 + 1;
      }
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::clear
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 0xb63403);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nr_Redges((RegionGraph *)0xb6342b);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      local_218 = 0;
      while( true ) {
        this_02 = (RegionGraph *)(**(code **)(*in_RDI + 0x28))();
        sVar9 = RegionGraph::nr_Redges((RegionGraph *)0xb6347e);
        if (sVar9 <= local_218) break;
        (**(code **)(*in_RDI + 0x28))();
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::Redge(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08);
        RegionGraph::IR(in_stack_fffffffffffffb10,(long)in_stack_fffffffffffffb08);
        TFactor<double>::TFactor
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (Real)in_stack_fffffffffffffb20);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   in_stack_fffffffffffffb10,&in_stack_fffffffffffffb08->super_Factor);
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffb10);
        local_218 = local_218 + 1;
      }
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::Check_Counting_Numbers(this_02);
      uVar13 = (**(code **)(*in_RDI + 0x30))();
      if (2 < uVar13) {
        std::operator<<((ostream *)&std::cout,"Resulting regiongraph: ");
        (**(code **)(*in_RDI + 0x28))();
        poVar12 = libDAI::operator<<(poVar12,rg);
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      }
      WeightedGraph<int>::~WeightedGraph((WeightedGraph<int> *)0xb63636);
      return;
    }
    local_148 = 0;
    while( true ) {
      uVar13 = local_148;
      (**(code **)(*in_RDI + 0x28))();
      sVar9 = RegionGraph::nr_ORs((RegionGraph *)0xb62b31);
      if (sVar9 <= uVar13) break;
      (**(code **)(*in_RDI + 0x28))();
      this_00 = RegionGraph::OR(in_stack_fffffffffffffb10,(long)in_stack_fffffffffffffb08);
      TFactor<double>::vars(&this_00->super_Factor);
      plVar4 = (long *)(**(code **)(*in_RDI + 0x28))();
      this_01 = (TFactor<double> *)(**(code **)(*plVar4 + 0x50))(plVar4,local_140);
      TFactor<double>::vars(this_01);
      bVar2 = VarSet::operator>>((VarSet *)in_stack_fffffffffffffb10,
                                 (VarSet *)in_stack_fffffffffffffb08);
      if (bVar2) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::setFac2OR
                  (in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18,
                   (size_t)in_stack_fffffffffffffb10);
        break;
      }
      local_148 = local_148 + 1;
    }
    local_140 = local_140 + 1;
  } while( true );
}

Assistant:

void JTree::GenerateJT( const std::vector<VarSet> &Cliques ) {
        // Construct a weighted graph (each edge is weighted with the cardinality 
        // of the intersection of the nodes, where the nodes are the elements of
        // Cliques).
        size_t N = grm().nrVars();
        WeightedGraph<int> JuncGraph;
        for( size_t i = 0; i < Cliques.size(); i++ )
            for( size_t j = i+1; j < Cliques.size(); j++ ) {
                size_t w = (Cliques[i] & Cliques[j]).size();
                if( w ) 
                    JuncGraph[UEdge(i,j)] = N - w;
            }
        
        // Construct minimal spanning tree using Prim's algorithm
        _RTree = MinSpanningTreePrims( JuncGraph);

        // Construct corresponding region graph

        // Create outer regions
        grm().ORs().reserve( Cliques.size() );
        for( size_t i = 0; i < Cliques.size(); i++ )
            grm().ORs().push_back( FRegion( Factor(Cliques[i], 1.0), 1.0 ) );

        // For each factor, find an outer region that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                if( grm().OR(alpha).vars() >> grm().factor(I).vars() ) {
    //              grm().OR(alpha) *= grm().factor(I);
                    grm().setFac2OR(I, alpha);
                    break;
                }
            assert( alpha != grm().nr_ORs() );
        }
        grm().RecomputeORs();

        // Create inner regions and edges
        grm().IRs().reserve( _RTree.size() );
        grm().Redges().reserve( 2 * _RTree.size() );
        for( size_t i = 0; i < _RTree.size(); i++ ) {
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n1, grm().IRs().size() ) );
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n2, grm().IRs().size() ) );
            // inner clusters have counting number -1
            grm().IRs().push_back( Region( Cliques[_RTree[i].n1] & Cliques[_RTree[i].n2], -1.0 ) );
        }

        // Regenerate BipartiteGraph internals
        grm().Regenerate();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 ) {
            cout << "Resulting regiongraph: " << grm() << endl;
        }
    }